

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

TypeCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type&,soul::pool_ref<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,Type *args_1,pool_ref<soul::AST::Expression> *args_2)

{
  PoolItem *pPVar1;
  Type TStack_48;
  
  pPVar1 = allocateSpaceForObject(this,0x50);
  Type::Type(&TStack_48,args_1);
  AST::TypeCast::TypeCast((TypeCast *)&pPVar1->item,args,&TStack_48,args_2->object);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_48.structure);
  pPVar1->destructor =
       allocate<soul::AST::TypeCast,_soul::AST::Context_&,_soul::Type_&,_soul::pool_ref<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TypeCast *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }